

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O1

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetAllKeys
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pSection,
          TNamesDepend *a_names)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  bool bVar3;
  const_iterator cVar4;
  _Base_ptr p_Var5;
  char *pLeft;
  bool bVar6;
  key_type local_48;
  
  p_Var2 = (a_names->
           super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)a_names) {
    p_Var1 = (((_List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var2);
    p_Var2 = p_Var1;
  }
  (a_names->
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)a_names;
  (a_names->
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)a_names;
  (a_names->
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  )._M_impl._M_node._M_size = 0;
  if (a_pSection == (char *)0x0) {
    bVar6 = false;
  }
  else {
    local_48.pComment = (char *)0x0;
    local_48.nOrder = 0;
    local_48.pItem = a_pSection;
    cVar4 = std::
            _Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>_>
            ::find(&(this->m_data)._M_t,&local_48);
    bVar6 = (_Rb_tree_header *)cVar4._M_node != &(this->m_data)._M_t._M_impl.super__Rb_tree_header;
    if (bVar6) {
      p_Var5 = cVar4._M_node[2]._M_left;
      if (p_Var5 != cVar4._M_node + 2) {
        pLeft = (char *)0x0;
        do {
          if ((pLeft == (char *)0x0) ||
             (bVar3 = SI_GenericNoCase<char>::operator()
                                ((SI_GenericNoCase<char> *)
                                 &CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::
                                  IsLess(char_const*,char_const*)::isLess,pLeft,
                                 *(char **)(p_Var5 + 1)), bVar3)) {
            std::__cxx11::
            list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
            ::
            _M_insert<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const&>
                      ((list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
                        *)a_names,(iterator)a_names,(Entry *)(p_Var5 + 1));
            pLeft = *(char **)(p_Var5 + 1);
          }
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        } while (p_Var5 != cVar4._M_node + 2);
      }
    }
  }
  return bVar6;
}

Assistant:

bool CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::GetAllKeys(const SI_CHAR *a_pSection,
																	TNamesDepend &a_names) const {
	a_names.clear();

	if (!a_pSection) {
		return false;
	}

	typename TSection::const_iterator iSection = m_data.find(a_pSection);
	if (iSection == m_data.end()) {
		return false;
	}

	const TKeyVal &section = iSection->second;
	const SI_CHAR *pLastKey = NULL;
	typename TKeyVal::const_iterator iKeyVal = section.begin();
	for (int n = 0; iKeyVal != section.end(); ++iKeyVal, ++n) {
		if (!pLastKey || IsLess(pLastKey, iKeyVal->first.pItem)) {
			a_names.push_back(iKeyVal->first);
			pLastKey = iKeyVal->first.pItem;
		}
	}

	return true;
}